

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ph.h
# Opt level: O3

edata_t * duckdb_je_edata_avail_remove_first(edata_avail_t *ph)

{
  edata_t *peVar1;
  edata_t *peVar2;
  edata_t *peVar3;
  uintptr_t a_eaddr;
  edata_t *peVar4;
  edata_t *peVar5;
  uintptr_t a_eaddr_1;
  edata_t *peVar6;
  uintptr_t b_eaddr;
  edata_t *peVar7;
  ulong uVar8;
  uintptr_t b_eaddr_2;
  ulong uVar9;
  
  peVar1 = (edata_t *)(ph->ph).root;
  if (peVar1 == (edata_t *)0x0) {
    return peVar1;
  }
  (ph->ph).auxcount = 0;
  peVar4 = (peVar1->field_5).ql_link_active.qre_prev;
  if (peVar4 == (edata_t *)0x0) {
    peVar4 = *(edata_t **)((long)&peVar1->field_5 + 0x10);
    if (peVar4 == (edata_t *)0x0) {
      peVar4 = (edata_t *)0x0;
      goto LAB_01171401;
    }
  }
  else {
    (peVar1->field_5).ql_link_active.qre_next = (edata_t *)0x0;
    (peVar1->field_5).ql_link_active.qre_prev = (edata_t *)0x0;
    (peVar4->field_5).ql_link_active.qre_next = (edata_t *)0x0;
    peVar5 = (peVar4->field_5).ql_link_active.qre_prev;
    if (peVar5 != (edata_t *)0x0) {
      peVar7 = (peVar5->field_5).ql_link_active.qre_prev;
      if (peVar7 != (edata_t *)0x0) {
        (peVar7->field_5).ql_link_active.qre_next = (edata_t *)0x0;
      }
      (peVar4->field_5).ql_link_active.qre_next = (edata_t *)0x0;
      (peVar4->field_5).ql_link_active.qre_prev = (edata_t *)0x0;
      (peVar5->field_5).ql_link_active.qre_next = (edata_t *)0x0;
      (peVar5->field_5).ql_link_active.qre_prev = (edata_t *)0x0;
      uVar9 = (peVar4->field_2).e_size_esn & 0xfff;
      uVar8 = (peVar5->field_2).e_size_esn & 0xfff;
      if ((int)(((uint)(uVar8 < uVar9) - (uint)(uVar9 < uVar8)) * 2 - (uint)(peVar4 < peVar5)) < 0)
      {
        (peVar5->field_5).ql_link_active.qre_next = peVar4;
        peVar6 = *(edata_t **)((long)&peVar4->field_5 + 0x10);
        (peVar5->field_5).ql_link_active.qre_prev = peVar6;
        if (peVar6 != (edata_t *)0x0) {
          (peVar6->field_5).ql_link_active.qre_next = peVar5;
        }
        *(edata_t **)((long)&peVar4->field_5 + 0x10) = peVar5;
        peVar5 = peVar4;
      }
      else {
        (peVar4->field_5).ql_link_active.qre_next = peVar5;
        peVar6 = *(edata_t **)((long)&peVar5->field_5 + 0x10);
        (peVar4->field_5).ql_link_active.qre_prev = peVar6;
        if (peVar6 != (edata_t *)0x0) {
          (peVar6->field_5).ql_link_active.qre_next = peVar4;
        }
        *(edata_t **)((long)&peVar5->field_5 + 0x10) = peVar4;
        peVar4 = peVar5;
      }
      while (peVar6 = peVar7, peVar7 = peVar4, peVar6 != (edata_t *)0x0) {
        peVar2 = (peVar6->field_5).ql_link_active.qre_prev;
        if (peVar2 == (edata_t *)0x0) {
          (peVar4->field_5).ql_link_active.qre_prev = peVar6;
          peVar7 = peVar6;
          break;
        }
        peVar7 = (peVar2->field_5).ql_link_active.qre_prev;
        if (peVar7 != (edata_t *)0x0) {
          (peVar7->field_5).ql_link_active.qre_next = (edata_t *)0x0;
        }
        (peVar6->field_5).ql_link_active.qre_next = (edata_t *)0x0;
        (peVar6->field_5).ql_link_active.qre_prev = (edata_t *)0x0;
        (peVar2->field_5).ql_link_active.qre_next = (edata_t *)0x0;
        (peVar2->field_5).ql_link_active.qre_prev = (edata_t *)0x0;
        uVar9 = (peVar6->field_2).e_size_esn & 0xfff;
        uVar8 = (peVar2->field_2).e_size_esn & 0xfff;
        if ((int)(((uint)(uVar8 < uVar9) - (uint)(uVar9 < uVar8)) * 2 - (uint)(peVar6 < peVar2)) < 0
           ) {
          (peVar2->field_5).ql_link_active.qre_next = peVar6;
          peVar3 = *(edata_t **)((long)&peVar6->field_5 + 0x10);
          (peVar2->field_5).ql_link_active.qre_prev = peVar3;
          if (peVar3 != (edata_t *)0x0) {
            (peVar3->field_5).ql_link_active.qre_next = peVar2;
          }
          *(edata_t **)((long)&peVar6->field_5 + 0x10) = peVar2;
        }
        else {
          (peVar6->field_5).ql_link_active.qre_next = peVar2;
          peVar3 = *(edata_t **)((long)&peVar2->field_5 + 0x10);
          (peVar6->field_5).ql_link_active.qre_prev = peVar3;
          if (peVar3 != (edata_t *)0x0) {
            (peVar3->field_5).ql_link_active.qre_next = peVar6;
          }
          *(edata_t **)((long)&peVar2->field_5 + 0x10) = peVar6;
          peVar6 = peVar2;
        }
        (peVar4->field_5).ql_link_active.qre_prev = peVar6;
        peVar4 = peVar6;
      }
      peVar6 = (peVar5->field_5).ql_link_active.qre_prev;
      peVar4 = peVar5;
      if (peVar6 != (edata_t *)0x0) {
        while( true ) {
          peVar2 = (peVar6->field_5).ql_link_active.qre_prev;
          (peVar5->field_5).ql_link_active.qre_prev = (edata_t *)0x0;
          (peVar6->field_5).ql_link_active.qre_prev = (edata_t *)0x0;
          uVar9 = (peVar5->field_2).e_size_esn & 0xfff;
          uVar8 = (peVar6->field_2).e_size_esn & 0xfff;
          if ((int)(((uint)(uVar8 < uVar9) - (uint)(uVar9 < uVar8)) * 2 - (uint)(peVar5 < peVar6)) <
              0) {
            (peVar6->field_5).ql_link_active.qre_next = peVar5;
            peVar4 = *(edata_t **)((long)&peVar5->field_5 + 0x10);
            (peVar6->field_5).ql_link_active.qre_prev = peVar4;
            if (peVar4 != (edata_t *)0x0) {
              (peVar4->field_5).ql_link_active.qre_next = peVar6;
            }
            *(edata_t **)((long)&peVar5->field_5 + 0x10) = peVar6;
            peVar4 = peVar5;
          }
          else {
            (peVar5->field_5).ql_link_active.qre_next = peVar6;
            peVar4 = *(edata_t **)((long)&peVar6->field_5 + 0x10);
            (peVar5->field_5).ql_link_active.qre_prev = peVar4;
            if (peVar4 != (edata_t *)0x0) {
              (peVar4->field_5).ql_link_active.qre_next = peVar5;
            }
            *(edata_t **)((long)&peVar6->field_5 + 0x10) = peVar5;
            peVar4 = peVar6;
          }
          if (peVar2 == (edata_t *)0x0) break;
          (peVar7->field_5).ql_link_active.qre_prev = peVar4;
          peVar6 = (peVar2->field_5).ql_link_active.qre_prev;
          peVar5 = peVar2;
          peVar7 = peVar4;
        }
      }
    }
    (peVar4->field_5).ql_link_active.qre_next = peVar1;
    peVar5 = *(edata_t **)((long)&peVar1->field_5 + 0x10);
    (peVar4->field_5).ql_link_active.qre_prev = peVar5;
    if (peVar5 != (edata_t *)0x0) {
      (peVar5->field_5).ql_link_active.qre_next = peVar4;
    }
    *(edata_t **)((long)&peVar1->field_5 + 0x10) = peVar4;
  }
  peVar5 = (peVar4->field_5).ql_link_active.qre_prev;
  if (peVar5 != (edata_t *)0x0) {
    peVar7 = (peVar5->field_5).ql_link_active.qre_prev;
    if (peVar7 != (edata_t *)0x0) {
      (peVar7->field_5).ql_link_active.qre_next = (edata_t *)0x0;
    }
    (peVar4->field_5).ql_link_active.qre_next = (edata_t *)0x0;
    (peVar4->field_5).ql_link_active.qre_prev = (edata_t *)0x0;
    (peVar5->field_5).ql_link_active.qre_next = (edata_t *)0x0;
    (peVar5->field_5).ql_link_active.qre_prev = (edata_t *)0x0;
    uVar9 = (peVar4->field_2).e_size_esn & 0xfff;
    uVar8 = (peVar5->field_2).e_size_esn & 0xfff;
    if ((int)(((uint)(uVar8 < uVar9) - (uint)(uVar9 < uVar8)) * 2 - (uint)(peVar4 < peVar5)) < 0) {
      (peVar5->field_5).ql_link_active.qre_next = peVar4;
      peVar6 = *(edata_t **)((long)&peVar4->field_5 + 0x10);
      (peVar5->field_5).ql_link_active.qre_prev = peVar6;
      if (peVar6 != (edata_t *)0x0) {
        (peVar6->field_5).ql_link_active.qre_next = peVar5;
      }
      *(edata_t **)((long)&peVar4->field_5 + 0x10) = peVar5;
      peVar5 = peVar4;
    }
    else {
      (peVar4->field_5).ql_link_active.qre_next = peVar5;
      peVar6 = *(edata_t **)((long)&peVar5->field_5 + 0x10);
      (peVar4->field_5).ql_link_active.qre_prev = peVar6;
      if (peVar6 != (edata_t *)0x0) {
        (peVar6->field_5).ql_link_active.qre_next = peVar4;
      }
      *(edata_t **)((long)&peVar5->field_5 + 0x10) = peVar4;
      peVar4 = peVar5;
    }
    while (peVar6 = peVar7, peVar7 = peVar4, peVar6 != (edata_t *)0x0) {
      peVar2 = (peVar6->field_5).ql_link_active.qre_prev;
      if (peVar2 == (edata_t *)0x0) {
        (peVar4->field_5).ql_link_active.qre_prev = peVar6;
        peVar7 = peVar6;
        break;
      }
      peVar7 = (peVar2->field_5).ql_link_active.qre_prev;
      if (peVar7 != (edata_t *)0x0) {
        (peVar7->field_5).ql_link_active.qre_next = (edata_t *)0x0;
      }
      (peVar6->field_5).ql_link_active.qre_next = (edata_t *)0x0;
      (peVar6->field_5).ql_link_active.qre_prev = (edata_t *)0x0;
      (peVar2->field_5).ql_link_active.qre_next = (edata_t *)0x0;
      (peVar2->field_5).ql_link_active.qre_prev = (edata_t *)0x0;
      uVar9 = (peVar6->field_2).e_size_esn & 0xfff;
      uVar8 = (peVar2->field_2).e_size_esn & 0xfff;
      if ((int)(((uint)(uVar8 < uVar9) - (uint)(uVar9 < uVar8)) * 2 - (uint)(peVar6 < peVar2)) < 0)
      {
        (peVar2->field_5).ql_link_active.qre_next = peVar6;
        peVar3 = *(edata_t **)((long)&peVar6->field_5 + 0x10);
        (peVar2->field_5).ql_link_active.qre_prev = peVar3;
        if (peVar3 != (edata_t *)0x0) {
          (peVar3->field_5).ql_link_active.qre_next = peVar2;
        }
        *(edata_t **)((long)&peVar6->field_5 + 0x10) = peVar2;
      }
      else {
        (peVar6->field_5).ql_link_active.qre_next = peVar2;
        peVar3 = *(edata_t **)((long)&peVar2->field_5 + 0x10);
        (peVar6->field_5).ql_link_active.qre_prev = peVar3;
        if (peVar3 != (edata_t *)0x0) {
          (peVar3->field_5).ql_link_active.qre_next = peVar6;
        }
        *(edata_t **)((long)&peVar2->field_5 + 0x10) = peVar6;
        peVar6 = peVar2;
      }
      (peVar4->field_5).ql_link_active.qre_prev = peVar6;
      peVar4 = peVar6;
    }
    peVar6 = (peVar5->field_5).ql_link_active.qre_prev;
    peVar4 = peVar5;
    if (peVar6 != (edata_t *)0x0) {
      while( true ) {
        peVar2 = (peVar6->field_5).ql_link_active.qre_prev;
        (peVar5->field_5).ql_link_active.qre_prev = (edata_t *)0x0;
        (peVar6->field_5).ql_link_active.qre_prev = (edata_t *)0x0;
        uVar9 = (peVar5->field_2).e_size_esn & 0xfff;
        uVar8 = (peVar6->field_2).e_size_esn & 0xfff;
        if ((int)(((uint)(uVar8 < uVar9) - (uint)(uVar9 < uVar8)) * 2 - (uint)(peVar5 < peVar6)) < 0
           ) {
          (peVar6->field_5).ql_link_active.qre_next = peVar5;
          peVar4 = *(edata_t **)((long)&peVar5->field_5 + 0x10);
          (peVar6->field_5).ql_link_active.qre_prev = peVar4;
          if (peVar4 != (edata_t *)0x0) {
            (peVar4->field_5).ql_link_active.qre_next = peVar6;
          }
          *(edata_t **)((long)&peVar5->field_5 + 0x10) = peVar6;
          peVar4 = peVar5;
        }
        else {
          (peVar5->field_5).ql_link_active.qre_next = peVar6;
          peVar4 = *(edata_t **)((long)&peVar6->field_5 + 0x10);
          (peVar5->field_5).ql_link_active.qre_prev = peVar4;
          if (peVar4 != (edata_t *)0x0) {
            (peVar4->field_5).ql_link_active.qre_next = peVar5;
          }
          *(edata_t **)((long)&peVar6->field_5 + 0x10) = peVar5;
          peVar4 = peVar6;
        }
        if (peVar2 == (edata_t *)0x0) break;
        (peVar7->field_5).ql_link_active.qre_prev = peVar4;
        peVar6 = (peVar2->field_5).ql_link_active.qre_prev;
        peVar5 = peVar2;
        peVar7 = peVar4;
      }
    }
  }
LAB_01171401:
  (ph->ph).root = peVar4;
  return peVar1;
}

Assistant:

JEMALLOC_ALWAYS_INLINE void *
ph_remove_first(ph_t *ph, size_t offset, ph_cmp_t cmp) {
	void *ret;

	if (ph->root == NULL) {
		return NULL;
	}
	ph_merge_aux(ph, offset, cmp);
	ret = ph->root;
	ph->root = ph_merge_children(ph->root, offset, cmp);

	return ret;

}